

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_tif_info(uint32_t width,uint32_t height,uint16_t bps,uint16_t spp,uint16_t config,
                   uint16_t type)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  undefined2 in_register_0000008a;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"  Resolution: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"px x ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"px");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"  Type: ");
  switch(CONCAT22(in_register_0000008a,type)) {
  case 1:
    pcVar2 = "uint";
    break;
  case 2:
    pcVar2 = "int";
    break;
  case 3:
    pcVar2 = "float";
    break;
  case 4:
    pcVar2 = "void";
    break;
  case 5:
    pcVar2 = "complex int";
    break;
  case 6:
    pcVar2 = "complex float";
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cout,"unrecognized");
    goto LAB_00105611;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,bps);
LAB_00105611:
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"  Planar config:");
  pcVar2 = "unrecognized";
  if (config == 2) {
    pcVar2 = "separate";
  }
  pcVar3 = "contig";
  if (config != 1) {
    pcVar3 = pcVar2;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void print_tif_info(
    uint32_t width, uint32_t height,
    uint16_t bps, uint16_t spp,
    uint16_t config,
    uint16_t type)
{
    std::cout << "  Resolution: " << width << "px x " <<  height << "px" << std::endl;
    std::cout << "  Type: ";

    switch (type) {
        case SAMPLEFORMAT_UINT:
            std::cout << "uint" << bps << std::endl;
            break;
        case SAMPLEFORMAT_INT:
            std::cout << "int" << bps << std::endl;
            break;
        case SAMPLEFORMAT_IEEEFP:
            std::cout << "float" << bps << std::endl;
            break;
        case SAMPLEFORMAT_VOID:
            std::cout << "void" << bps << std::endl;
            break;
        case SAMPLEFORMAT_COMPLEXINT:
            std::cout << "complex int" << bps << std::endl;
            break;
        case SAMPLEFORMAT_COMPLEXIEEEFP:
            std::cout << "complex float" << bps << std::endl;
            break;
        default:
            std::cout << "unrecognized" << std::endl;
            break;
    }

    std::cout << "  Planar config:";

    switch (config) {
        case PLANARCONFIG_CONTIG:
            std::cout << "contig" << std::endl;
            break;
        case PLANARCONFIG_SEPARATE:
            std::cout << "separate" << std::endl;
            break;
        default:
            std::cout << "unrecognized" << std::endl;
            break;
    }
}